

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SPIRFunction * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::allocate<spirv_cross::SPIRFunction&>
          (ObjectPool<spirv_cross::SPIRFunction> *this,SPIRFunction *p)

{
  uint uVar1;
  SPIRFunction *this_00;
  bool bVar2;
  size_t sVar3;
  SPIRFunction **ppSVar4;
  SPIRFunction *ptr;
  uint local_34;
  SPIRFunction *pSStack_30;
  uint i;
  SPIRFunction *ptr_1;
  SPIRFunction *pSStack_20;
  uint num_objects;
  SPIRFunction *p_local;
  ObjectPool<spirv_cross::SPIRFunction> *this_local;
  
  pSStack_20 = p;
  p_local = (SPIRFunction *)this;
  bVar2 = VectorView<spirv_cross::SPIRFunction_*>::empty
                    (&(this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>);
  if (bVar2) {
    uVar1 = this->start_object_count;
    sVar3 = VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
            ::size(&(this->memory).
                    super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
                  );
    ptr_1._4_4_ = uVar1 << ((byte)sVar3 & 0x1f);
    pSStack_30 = (SPIRFunction *)malloc((ulong)ptr_1._4_4_ * 800);
    if (pSStack_30 == (SPIRFunction *)0x0) {
      return (SPIRFunction *)0x0;
    }
    for (local_34 = 0; local_34 < ptr_1._4_4_; local_34 = local_34 + 1) {
      ptr = pSStack_30 + local_34;
      SmallVector<spirv_cross::SPIRFunction_*,_0UL>::push_back(&this->vacants,&ptr);
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRFunction,spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRFunction*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRFunction,spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>,8ul>
                *)&this->memory,&stack0xffffffffffffffd0);
  }
  ppSVar4 = VectorView<spirv_cross::SPIRFunction_*>::back
                      (&(this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>);
  this_00 = *ppSVar4;
  SmallVector<spirv_cross::SPIRFunction_*,_0UL>::pop_back(&this->vacants);
  SPIRFunction::SPIRFunction(this_00,pSStack_20);
  return this_00;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}